

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O1

Expression __thiscall cnn::expr::conv1d_narrow(expr *this,Expression *x,Expression *f)

{
  pointer *pppNVar1;
  ComputationGraph *this_00;
  iterator __position;
  Node *pNVar2;
  undefined8 extraout_RDX;
  Expression EVar3;
  initializer_list<cnn::VariableIndex> __l;
  VariableIndex new_node_index;
  allocator_type local_35;
  VariableIndex local_34;
  Node *local_30;
  VariableIndex local_28;
  uint local_24;
  
  this_00 = x->pg;
  local_28.t = (x->i).t;
  local_24 = (f->i).t;
  local_34.t = (uint)((ulong)((long)(this_00->nodes).
                                    super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                             (long)(this_00->nodes).
                                   super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>.
                                   _M_impl.super__Vector_impl_data._M_start) >> 3);
  pNVar2 = (Node *)operator_new(0x50);
  pNVar2->_vptr_Node = (_func_int **)&PTR__Node_002aacd0;
  __l._M_len = 2;
  __l._M_array = &local_28;
  std::vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>::vector
            (&pNVar2->args,__l,&local_35);
  (pNVar2->dim).nd = 0;
  (pNVar2->dim).bd = 1;
  pNVar2->_vptr_Node = (_func_int **)&PTR__Node_002aaea8;
  __position._M_current =
       (this_00->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_30 = pNVar2;
  if (__position._M_current ==
      (this_00->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cnn::Node*,std::allocator<cnn::Node*>>::_M_realloc_insert<cnn::Node*>
              ((vector<cnn::Node*,std::allocator<cnn::Node*>> *)this_00,__position,&local_30);
  }
  else {
    *__position._M_current = pNVar2;
    pppNVar1 = &(this_00->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppNVar1 = *pppNVar1 + 1;
  }
  ComputationGraph::set_dim_for_new_node(this_00,&local_34);
  *(ComputationGraph **)this = this_00;
  *(uint *)(this + 8) = local_34.t;
  EVar3._8_8_ = extraout_RDX;
  EVar3.pg = (ComputationGraph *)this;
  return EVar3;
}

Assistant:

Expression conv1d_narrow(const Expression& x, const Expression& f) { return Expression(x.pg, x.pg->add_function<Conv1DNarrow>({x.i, f.i})); }